

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
llvm::SmallVectorImpl<(anonymous_namespace)::SimpleKey>::erase
          (SmallVectorImpl<(anonymous_namespace)::SimpleKey> *this,const_iterator CI)

{
  void *pvVar1;
  size_t sVar2;
  iterator N;
  iterator I;
  const_iterator CI_local;
  SmallVectorImpl<(anonymous_namespace)::SimpleKey> *this_local;
  
  if (CI < (const_iterator)
           (this->super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>).
           super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
           super_SmallVectorBase.BeginX) {
    __assert_fail("I >= this->begin() && \"Iterator to erase is out of bounds.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1c1,
                  "iterator llvm::SmallVectorImpl<(anonymous namespace)::SimpleKey>::erase(const_iterator) [T = (anonymous namespace)::SimpleKey]"
                 );
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>).
           super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
           super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  if ((const_iterator)((long)pvVar1 + sVar2 * 0x18) <= CI) {
    __assert_fail("I < this->end() && \"Erasing at past-the-end iterator.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1c2,
                  "iterator llvm::SmallVectorImpl<(anonymous namespace)::SimpleKey>::erase(const_iterator) [T = (anonymous namespace)::SimpleKey]"
                 );
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>).
           super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
           super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  std::move<(anonymous_namespace)::SimpleKey*,(anonymous_namespace)::SimpleKey*>
            (CI + 1,(SimpleKey *)((long)pvVar1 + sVar2 * 0x18),CI);
  SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>::pop_back
            (&this->super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>);
  return CI;
}

Assistant:

iterator erase(const_iterator CI) {
    // Just cast away constness because this is a non-const member function.
    iterator I = const_cast<iterator>(CI);

    assert(I >= this->begin() && "Iterator to erase is out of bounds.");
    assert(I < this->end() && "Erasing at past-the-end iterator.");

    iterator N = I;
    // Shift all elts down one.
    std::move(I+1, this->end(), I);
    // Drop the last elt.
    this->pop_back();
    return(N);
  }